

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

string * FIX::string_strip(string *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  long lVar2;
  size_type sVar3;
  pointer pcVar4;
  
  if (value->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (value->_M_dataplus)._M_p;
    sVar3 = 0;
  }
  else {
    uVar1 = std::__cxx11::string::find_first_not_of((char *)value,0x1c8d58,0);
    lVar2 = std::__cxx11::string::find_last_not_of((char *)value,0x1c8d58,0xffffffffffffffff);
    if (uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)value,uVar1,(lVar2 - uVar1) + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (value->_M_dataplus)._M_p;
    sVar3 = value->_M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar4,pcVar4 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string string_strip( const std::string& value )
{
  if( !value.size() )
    return value;

  size_t startPos = value.find_first_not_of(" \t\r\n");
  size_t endPos = value.find_last_not_of(" \t\r\n");

  if( startPos == std::string::npos )
   return value;

  return std::string( value, startPos, endPos - startPos + 1 );
}